

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void (anonymous_namespace)::check<char_const*>(istream *is,char *c)

{
  int iVar1;
  ostream *poVar2;
  char *in_RSI;
  char v [1024];
  char acStack_418 [4];
  int in_stack_fffffffffffffbec;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffbf0;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,(char *)0x23f0dc);
  poVar2 = std::operator<<((ostream *)&std::cout,"zero-terminated string: expected \"");
  poVar2 = std::operator<<(poVar2,in_RSI);
  poVar2 = std::operator<<(poVar2,"\", got \"");
  poVar2 = std::operator<<(poVar2,acStack_418);
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = strcmp(in_RSI,acStack_418);
  if (iVar1 != 0) {
    __assert_fail("!strcmp (c, v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                  ,0x75,"void (anonymous namespace)::check(istream &, const char *)");
  }
  return;
}

Assistant:

void
check (istream& is, const char* c)
{
    char v[1024];

    Xdr::read<CharIO> (is, sizeof (v), v);

    cout << "zero-terminated string: "
            "expected \""
         << c
         << "\", "
            "got \""
         << v << "\"" << endl;

    assert (!strcmp (c, v));
}